

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_relaxng(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  FILE *pFVar11;
  xmlDocPtr pxVar12;
  undefined8 uVar13;
  size_t sVar14;
  xmlDocPtr pxVar15;
  xmlDocPtr val;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  char *pcVar16;
  int n_output;
  int iVar17;
  uint uVar18;
  undefined4 uVar19;
  int n_elem;
  uint uVar20;
  uint uVar21;
  undefined8 *puVar22;
  int test_ret_1;
  undefined4 *puVar23;
  int test_ret;
  int iVar24;
  uint *puVar25;
  int *piVar26;
  int test_ret_4;
  int test_ret_5;
  int test_ret_2;
  int test_ret_3;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing relaxng : 14 of 24 functions ...");
  }
  iVar24 = 0;
  iVar17 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (iVar17 == 0) {
      pFVar11 = fopen64("test.out","a+");
    }
    else {
      pFVar11 = (FILE *)0x0;
    }
    xmlRelaxNGDump(pFVar11);
    call_tests = call_tests + 1;
    if (pFVar11 != (FILE *)0x0) {
      fclose(pFVar11);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDump",(ulong)(uint)(iVar3 - iVar2));
      iVar24 = iVar24 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 == 1);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar17 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (iVar17 == 0) {
      pFVar11 = fopen64("test.out","a+");
    }
    else {
      pFVar11 = (FILE *)0x0;
    }
    xmlRelaxNGDumpTree(pFVar11);
    call_tests = call_tests + 1;
    if (pFVar11 != (FILE *)0x0) {
      fclose(pFVar11);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDumpTree",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 == 1);
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlRelaxNGGetParserErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar17 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  val = (xmlDocPtr)0x0;
  xmlRelaxNGGetValidErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetValidErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    val = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlRelaxNGInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    val = (xmlDocPtr)(ulong)(uint)(iVar8 - iVar6);
    printf("Leak of %d blocks found in xmlRelaxNGInitTypes");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar18 = 0;
  local_3c = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar12 = gen_xmlDocPtr(uVar18,(int)val);
    uVar13 = xmlRelaxNGNewDocParserCtxt(pxVar12);
    xmlRelaxNGFreeParserCtxt(uVar13);
    call_tests = call_tests + 1;
    if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
      xmlFreeDoc(pxVar12);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewDocParserCtxt",(ulong)(uint)(iVar9 - iVar8));
      local_3c = local_3c + 1;
      val = (xmlDocPtr)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar18 = 0;
  do {
    puVar25 = &DAT_0015fd28;
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar18 == 0) {
        bVar1 = false;
        pcVar16 = "foo";
      }
      else if (uVar18 == 2) {
        bVar1 = false;
        pcVar16 = "test/ent2";
      }
      else if (uVar18 == 1) {
        bVar1 = false;
        pcVar16 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar16 = (char *)0x0;
      }
      uVar21 = 0xffffffff;
      uVar20 = (uint)pxVar12;
      if (uVar20 < 4) {
        uVar21 = *puVar25;
      }
      if ((bVar1) || (sVar14 = strlen(pcVar16), (int)uVar21 <= (int)sVar14 + 1)) {
        val = (xmlDocPtr)(ulong)uVar21;
        uVar13 = xmlRelaxNGNewMemParserCtxt(pcVar16);
        xmlRelaxNGFreeParserCtxt(uVar13);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRelaxNGNewMemParserCtxt",
                 (ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",(ulong)uVar18);
          printf(" %d");
          putchar(10);
          val = pxVar12;
        }
      }
      uVar20 = uVar20 + 1;
      pxVar12 = (xmlDocPtr)(ulong)uVar20;
      puVar25 = puVar25 + 1;
    } while (uVar20 != 4);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  puVar22 = &DAT_00162d50;
  uVar18 = 0;
  local_44 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar18 < 3) {
      uVar13 = *puVar22;
    }
    else {
      uVar13 = 0;
    }
    xmlRelaxNGNewParserCtxt(uVar13);
    xmlRelaxNGFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewParserCtxt",(ulong)(uint)(iVar10 - iVar9));
      local_44 = local_44 + 1;
      val = (xmlDocPtr)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar18 != 4);
  iVar17 = iVar2 + iVar24 + (uint)(iVar17 != iVar3) + (uint)(iVar4 != iVar5) +
           (uint)(iVar6 != iVar7) + local_3c;
  function_tests = function_tests + 1;
  uVar18 = 0;
  local_40 = 0;
  do {
    iVar2 = (int)val;
    iVar24 = xmlMemBlocks();
    pxVar12 = gen_xmlDocPtr(uVar18,iVar2);
    val = pxVar12;
    xmlRelaxNGValidateDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
      xmlFreeDoc(pxVar12);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar24 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGValidateDoc",(ulong)(uint)(iVar2 - iVar24));
      local_40 = local_40 + 1;
      printf(" %d",0);
      val = (xmlDocPtr)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar18 = 0;
  do {
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar24 = (int)val;
      iVar2 = xmlMemBlocks();
      pxVar15 = gen_xmlDocPtr(uVar18,iVar24);
      iVar3 = (int)pxVar12;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar24);
      xmlRelaxNGValidateFullElement(0,pxVar15,val);
      call_tests = call_tests + 1;
      iVar24 = extraout_EDX;
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc(pxVar15);
        iVar24 = extraout_EDX_00;
      }
      des_xmlNodePtr(iVar3,(xmlNodePtr)val,iVar24);
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar2 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidateFullElement",
               (ulong)(uint)(iVar24 - iVar2));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  iVar17 = iVar17 + iVar8 + local_44;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar18 = 0;
  do {
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar24 = (int)val;
      iVar2 = xmlMemBlocks();
      pxVar15 = gen_xmlDocPtr(uVar18,iVar24);
      iVar3 = (int)pxVar12;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar24);
      xmlRelaxNGValidatePopElement(0,pxVar15,val);
      call_tests = call_tests + 1;
      iVar24 = extraout_EDX_01;
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc(pxVar15);
        iVar24 = extraout_EDX_02;
      }
      des_xmlNodePtr(iVar3,(xmlNodePtr)val,iVar24);
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar2 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePopElement",
               (ulong)(uint)(iVar24 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  iVar17 = iVar17 + local_40;
  local_40 = 0;
  uVar18 = 0;
  do {
    piVar26 = &DAT_0015fd28;
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar24 = xmlMemBlocks();
      switch(uVar18) {
      case 0:
        bVar1 = false;
        pcVar16 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar16 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar16 = anon_var_dwarf_1b8;
        break;
      case 3:
        bVar1 = false;
        pcVar16 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar16 = (char *)0x0;
      }
      iVar2 = -1;
      uVar21 = (uint)pxVar12;
      if (uVar21 < 4) {
        iVar2 = *piVar26;
      }
      if ((bVar1) || (sVar14 = strlen(pcVar16), iVar2 <= (int)sVar14 + 1)) {
        xmlRelaxNGValidatePushCData(0,pcVar16,iVar2);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        val = (xmlDocPtr)pcVar16;
        if (iVar24 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
                 (ulong)(uint)(iVar2 - iVar24));
          local_40 = local_40 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar18);
          printf(" %d");
          putchar(10);
          val = pxVar12;
        }
      }
      uVar21 = uVar21 + 1;
      pxVar12 = (xmlDocPtr)(ulong)uVar21;
      piVar26 = piVar26 + 1;
    } while (uVar21 != 4);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar18 = 0;
  do {
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar2 = (int)val;
      iVar3 = xmlMemBlocks();
      pxVar15 = gen_xmlDocPtr(uVar18,iVar2);
      iVar4 = (int)pxVar12;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar2);
      xmlRelaxNGValidatePushElement(0,pxVar15,val);
      call_tests = call_tests + 1;
      iVar2 = extraout_EDX_03;
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc(pxVar15);
        iVar2 = extraout_EDX_04;
      }
      des_xmlNodePtr(iVar4,(xmlNodePtr)val,iVar2);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar3 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
               (ulong)(uint)(iVar2 - iVar3));
        iVar24 = iVar24 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  puVar23 = &DAT_0015fd28;
  uVar18 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar19 = 0xffffffff;
    if (uVar18 < 4) {
      uVar19 = *puVar23;
    }
    xmlRelaxParserSetFlag(0,uVar19);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxParserSetFlag",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar18);
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar23 = puVar23 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  uVar18 = iVar17 + local_3c + local_44 + local_40 + iVar24 + iVar2;
  if (uVar18 != 0) {
    printf("Module relaxng: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 24 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}